

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

size_type __thiscall
lf::assemble::DynamicFEDofHandler::NumLocalDofs(DynamicFEDofHandler *this,Entity *entity)

{
  element_type *peVar1;
  pointer puVar2;
  int iVar3;
  dim_t dVar4;
  uint uVar5;
  
  iVar3 = (*entity->_vptr_Entity[4])(entity);
  dVar4 = base::internal::DimensionImpl((RefElType)iVar3);
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar5 = (*peVar1->_vptr_Mesh[5])(peVar1,entity);
  puVar2 = (this->offsets_)._M_elems[2 - dVar4].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  return puVar2[uVar5 + 1] - puVar2[uVar5];
}

Assistant:

size_type DynamicFEDofHandler::NumLocalDofs(
    const lf::mesh::Entity &entity) const {
  const lf::base::RefEl ref_el_type = entity.RefEl();
  const dim_t codim = 2 - ref_el_type.Dimension();
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  return (offsets_[codim][entity_index + 1] - offsets_[codim][entity_index]);
}